

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_implementation.hpp
# Opt level: O2

event_queue_t * __thiscall
so_5::disp::thread_pool::common_implementation::
dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>
::bind_agent(dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>
             *this,agent_ref_t *agent,bind_params_t *params)

{
  agent_t *paVar1;
  event_queue_t *peVar2;
  agent_ref_t *agent_00;
  agent_ref_t local_38;
  agent_ref_t local_30;
  
  agent_00 = &local_38;
  std::mutex::lock(&this->m_lock);
  paVar1 = agent->m_obj;
  if (params->m_fifo == individual) {
    agent_00 = &local_30;
    agent->m_obj = (agent_t *)0x0;
    local_30.m_obj = paVar1;
    peVar2 = bind_agent_with_inidividual_fifo(this,agent_00,params);
  }
  else {
    agent->m_obj = (agent_t *)0x0;
    local_38.m_obj = paVar1;
    peVar2 = bind_agent_with_cooperation_fifo(this,&local_38,params);
  }
  intrusive_ptr_t<so_5::agent_t>::~intrusive_ptr_t(agent_00);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_lock);
  return peVar2;
}

Assistant:

virtual event_queue_t *
		bind_agent( agent_ref_t agent, const PARAMS & params ) override
			{
				std::lock_guard< std::mutex > lock( m_lock );

				if( ADAPTATIONS::is_individual_fifo( params ) )
					return bind_agent_with_inidividual_fifo(
							std::move( agent ), params );

				return bind_agent_with_cooperation_fifo(
						std::move( agent ), params );
			}